

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O2

int IoTHubTransport_MQTT_Common_SetRetryPolicy
              (TRANSPORT_LL_HANDLE handle,IOTHUB_CLIENT_RETRY_POLICY retryPolicy,
              size_t retryTimeoutLimitInSeconds)

{
  RETRY_CONTROL_HANDLE retry_control_handle;
  RETRY_CONTROL_HANDLE pRVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0xe60;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xe60;
    }
    pcVar5 = "Invalid handle parameter. NULL.";
    iVar3 = 0xe5f;
  }
  else {
    pRVar1 = retry_control_create(retryPolicy,(uint)retryTimeoutLimitInSeconds);
    if (pRVar1 != (RETRY_CONTROL_HANDLE)0x0) {
      retry_control_handle = *(RETRY_CONTROL_HANDLE *)((long)handle + 0x110);
      *(RETRY_CONTROL_HANDLE *)((long)handle + 0x110) = pRVar1;
      retry_control_destroy(retry_control_handle);
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0xe69;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xe69;
    }
    pcVar5 = "Failed creating new retry control handle";
    iVar3 = 0xe68;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
            ,"IoTHubTransport_MQTT_Common_SetRetryPolicy",iVar3,1,pcVar5);
  return iVar4;
}

Assistant:

int IoTHubTransport_MQTT_Common_SetRetryPolicy(TRANSPORT_LL_HANDLE handle, IOTHUB_CLIENT_RETRY_POLICY retryPolicy, size_t retryTimeoutLimitInSeconds)
{
    int result;

    if (handle == NULL)
    {
        LogError("Invalid handle parameter. NULL.");
        result = MU_FAILURE;
    }
    else
    {
        RETRY_CONTROL_HANDLE new_retry_control_handle;

        if ((new_retry_control_handle = retry_control_create(retryPolicy, (unsigned int)retryTimeoutLimitInSeconds)) == NULL)
        {
            LogError("Failed creating new retry control handle");
            result = MU_FAILURE;
        }
        else
        {
            PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;
            RETRY_CONTROL_HANDLE previous_retry_control_handle = transport_data->retry_control_handle;

            transport_data->retry_control_handle = new_retry_control_handle;
            retry_control_destroy(previous_retry_control_handle);

            result = 0;
        }
    }

    return result;
}